

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::CreateHeapBlock(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                  *this,Recycler *recycler)

{
  uint32 *puVar1;
  HeapInfo *pHVar2;
  BOOL BVar3;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  
  this_00 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)GetUnusedHeapBlock(this);
  if (this_00 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    BVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::ReassignPages(this_00,recycler);
    if (BVar3 != 0) {
      pHVar2 = (this->super_HeapBucket).heapInfo;
      this_00->next =
           (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
           pHVar2->newMediumFinalizableWithBarrierHeapBlockList;
      pHVar2->newMediumFinalizableWithBarrierHeapBlockList =
           (MediumFinalizableWithBarrierHeapBlock *)this_00;
      LOCK();
      puVar1 = &(this->super_HeapBucket).newHeapBlockCount;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      return (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_00;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Reset(this_00);
    this_00->next = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->emptyBlockList;
    this->emptyBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)this_00;
    puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 + 1;
  }
  return (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
}

Assistant:

TBlockType *
HeapBucketT<TBlockType>::CreateHeapBlock(Recycler * recycler)
{
    FAULTINJECT_MEMORY_NOTHROW(_u("HeapBlock"), sizeof(TBlockType));

    // Add a new heap block
    TBlockType * heapBlock = GetUnusedHeapBlock();
    if (heapBlock == nullptr)
    {
        return nullptr;
    }

    if (!heapBlock->ReassignPages(recycler))
    {
        FreeHeapBlock(heapBlock);
        return nullptr;
    }

    // Add it to head of heap block list so we will keep track of the block
    this->heapInfo->AppendNewHeapBlock(heapBlock, this);
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if ENABLE_CONCURRENT_GC
    ::InterlockedIncrement(&this->newHeapBlockCount);
#else
    this->heapBlockCount++;
#endif
#endif
    return heapBlock;
}